

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O1

bool chaiscript::optimizer::
     contains_var_decl_in_scope<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
               (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node
               )

{
  AST_Node_Type AVar1;
  ulong uVar2;
  size_type sVar3;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node_00;
  size_t offset;
  bool bVar4;
  
  uVar2 = (ulong)(node->super_AST_Node).identifier;
  if ((uVar2 < 0x23) && ((0x400000060U >> (uVar2 & 0x3f) & 1) != 0)) {
LAB_00332b8b:
    bVar4 = true;
  }
  else {
    sVar3 = child_count<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(node);
    bVar4 = sVar3 != 0;
    if (bVar4) {
      offset = 0;
      do {
        node_00 = child_at<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                            (node,offset);
        AVar1 = (node_00->super_AST_Node).identifier;
        if ((Ranged_For < AVar1) || ((0x18400U >> (AVar1 & Attr_Decl) & 1) == 0)) {
          bVar4 = contains_var_decl_in_scope<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                            (node_00);
          if (bVar4) goto LAB_00332b8b;
        }
        offset = offset + 1;
      } while (sVar3 != offset);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool contains_var_decl_in_scope(const eval::AST_Node_Impl<T> &node) noexcept {
      if (node.identifier == AST_Node_Type::Var_Decl || node.identifier == AST_Node_Type::Assign_Decl
          || node.identifier == AST_Node_Type::Reference) {
        return true;
      }

      const auto num = child_count(node);

      for (size_t i = 0; i < num; ++i) {
        const auto &child = child_at(node, i);
        if (child.identifier != AST_Node_Type::Block && child.identifier != AST_Node_Type::For
            && child.identifier != AST_Node_Type::Ranged_For && contains_var_decl_in_scope(child)) {
          return true;
        }
      }

      return false;
    }